

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O3

void __thiscall
TCLAP::Arg::Arg(Arg *this,string *flag,string *name,string *desc,bool req,bool valreq,Visitor *v)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  SpecificationException *pSVar8;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  bool bVar12;
  string local_150;
  string *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  this->_vptr_Arg = (_func_int **)&PTR__Arg_00128748;
  local_c8 = &this->_flag;
  local_68 = &(this->_flag).field_2;
  (this->_flag)._M_dataplus._M_p = (pointer)local_68;
  pcVar4 = (flag->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar4,pcVar4 + flag->_M_string_length);
  local_130 = &this->_name;
  local_70 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)local_70;
  pcVar4 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar4,pcVar4 + name->_M_string_length);
  local_78 = &(this->_description).field_2;
  (this->_description)._M_dataplus._M_p = (pointer)local_78;
  pcVar4 = (desc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_description,pcVar4,pcVar4 + desc->_M_string_length);
  this->_required = req;
  psVar1 = &this->_requireLabel;
  local_80 = &(this->_requireLabel).field_2;
  (this->_requireLabel)._M_dataplus._M_p = (pointer)local_80;
  local_58 = &this->_description;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"required","");
  this->_valueRequired = valreq;
  this->_alreadySet = false;
  this->_visitor = v;
  this->_ignoreable = true;
  this->_xorSet = false;
  this->_acceptsMultipleValues = false;
  uVar5 = (this->_flag)._M_string_length;
  local_60 = psVar1;
  if (1 < uVar5) {
    pSVar8 = (SpecificationException *)__cxa_allocate_exception(0x68);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"Argument flag can only be one character long","");
    (*this->_vptr_Arg[7])(&local_108,this);
    SpecificationException::SpecificationException(pSVar8,&local_150,&local_108);
    __cxa_throw(pSVar8,&SpecificationException::typeinfo,ArgException::~ArgException);
  }
  paVar2 = &local_150.field_2;
  local_150.field_2._M_allocated_capacity._0_4_ = 0x6f6e6769;
  local_150.field_2._M_allocated_capacity._4_4_ = 0x725f6572;
  local_150._M_string_length = 0xb;
  local_150.field_2._8_4_ = 0x747365;
  local_150._M_dataplus._M_p = (pointer)paVar2;
  if (((this->_name)._M_string_length != 0xb) ||
     (plVar9 = (long *)(local_130->_M_dataplus)._M_p,
     *(long *)((long)plVar9 + 3) != 0x747365725f65726f || *plVar9 != 0x725f65726f6e6769)) {
    paVar3 = &local_108.field_2;
    local_108.field_2._M_local_buf[0] = '-';
    local_108.field_2._M_local_buf[1] = '\0';
    local_108._M_string_length = 1;
    local_108._M_dataplus._M_p = (pointer)paVar3;
    if ((uVar5 != 1) || (bVar12 = true, *(local_c8->_M_dataplus)._M_p != '-')) {
      local_128._M_string_length = 2;
      local_128.field_2._M_allocated_capacity._0_3_ = 0x2d2d;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      iVar6 = std::__cxx11::string::compare((char *)local_c8);
      bVar12 = iVar6 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar3) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT62(local_108.field_2._M_allocated_capacity._2_6_,
                                 CONCAT11(local_108.field_2._M_local_buf[1],
                                          local_108.field_2._M_local_buf[0])) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT44(local_150.field_2._M_allocated_capacity._4_4_,
                               local_150.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (bVar12) {
      pSVar8 = (SpecificationException *)__cxa_allocate_exception(0x68);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8.field_2._M_allocated_capacity._0_2_ = 0x2d;
      local_e8._M_string_length = 1;
      std::operator+(&local_a0,"Argument flag cannot be either \'",&local_e8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_a0);
      local_128._M_dataplus._M_p = (pointer)*plVar9;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_128._M_dataplus._M_p == psVar10) {
        local_128.field_2._M_allocated_capacity = *psVar10;
        local_128.field_2._8_8_ = plVar9[3];
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar10;
      }
      local_128._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
      local_c0._M_string_length = 2;
      local_c0.field_2._M_local_buf[2] = '\0';
      std::operator+(&local_108,&local_128,&local_c0);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_150._M_dataplus._M_p = (pointer)*plVar9;
      plVar11 = plVar9 + 2;
      if ((long *)local_150._M_dataplus._M_p == plVar11) {
        local_150.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
        local_150.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar9 + 0x14);
        local_150.field_2._8_4_ = (undefined4)plVar9[3];
        local_150.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
        local_150._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_150.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
        local_150.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar11 >> 0x20);
      }
      local_150._M_string_length = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      (*this->_vptr_Arg[7])(&local_50,this);
      SpecificationException::SpecificationException(pSVar8,&local_150,&local_50);
      __cxa_throw(pSVar8,&SpecificationException::typeinfo,ArgException::~ArgException);
    }
  }
  local_108.field_2._M_local_buf[0] = '-';
  local_108.field_2._M_local_buf[1] = '\0';
  local_108._M_string_length = 1;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::substr((ulong)&local_150,(ulong)local_130);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128.field_2._M_allocated_capacity._0_2_ = 0x2d;
  local_128._M_string_length = 1;
  if ((local_150._M_string_length != 1) || (bVar12 = true, *local_150._M_dataplus._M_p != '-')) {
    local_e8.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
    local_e8._M_string_length = 2;
    local_e8.field_2._M_local_buf[2] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_130);
    paVar3 = &local_c0.field_2;
    local_c0.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
    local_c0._M_string_length = 2;
    local_c0.field_2._M_local_buf[2] = '\0';
    local_c0._M_dataplus._M_p = (pointer)paVar3;
    if ((local_a0._M_string_length == 2) && (*(short *)local_a0._M_dataplus._M_p == 0x2d2d)) {
      bVar12 = true;
    }
    else {
      lVar7 = std::__cxx11::string::find((char *)local_130,0x1205cf,0);
      bVar12 = lVar7 != -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT53(local_c0.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_c0.field_2._M_local_buf[2],
                                          local_c0.field_2._M_allocated_capacity._0_2_)) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT53(local_e8.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_e8.field_2._M_local_buf[2],
                                        local_e8.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT44(local_150.field_2._M_allocated_capacity._4_4_,
                             local_150.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT62(local_108.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_108.field_2._M_local_buf[1],
                                      local_108.field_2._M_local_buf[0])) + 1);
  }
  if (bVar12) {
    pSVar8 = (SpecificationException *)__cxa_allocate_exception(0x68);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8.field_2._M_allocated_capacity._0_2_ = 0x2d;
    local_e8._M_string_length = 1;
    std::operator+(&local_a0,"Argument name begin with either \'",&local_e8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_128._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_128._M_dataplus._M_p == psVar10) {
      local_128.field_2._M_allocated_capacity = *psVar10;
      local_128.field_2._8_8_ = plVar9[3];
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar10;
    }
    local_128._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
    local_c0._M_string_length = 2;
    local_c0.field_2._M_local_buf[2] = '\0';
    std::operator+(&local_108,&local_128,&local_c0);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_150._M_dataplus._M_p = (pointer)*plVar9;
    plVar11 = plVar9 + 2;
    if ((long *)local_150._M_dataplus._M_p == plVar11) {
      local_150.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
      local_150.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)plVar9 + 0x14);
      local_150.field_2._8_4_ = (undefined4)plVar9[3];
      local_150.field_2._12_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar11;
      local_150.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar11 >> 0x20);
    }
    local_150._M_string_length = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    (*this->_vptr_Arg[7])(&local_50,this);
    SpecificationException::SpecificationException(pSVar8,&local_150,&local_50);
    __cxa_throw(pSVar8,&SpecificationException::typeinfo,ArgException::~ArgException);
  }
  return;
}

Assistant:

inline Arg::Arg(const std::string& flag,
         const std::string& name,
         const std::string& desc,
         bool req,
         bool valreq,
         Visitor* v) :
  _flag(flag),
  _name(name),
  _description(desc),
  _required(req),
  _requireLabel("required"),
  _valueRequired(valreq),
  _alreadySet(false),
  _visitor( v ),
  _ignoreable(true),
  _xorSet(false),
  _acceptsMultipleValues(false)
{
	if ( _flag.length() > 1 )
		throw(SpecificationException(
				"Argument flag can only be one character long", toString() ) );

	if ( _name != ignoreNameString() &&
		 ( _flag == Arg::flagStartString() ||
		   _flag == Arg::nameStartString() ||
		   _flag == " " ) )
		throw(SpecificationException("Argument flag cannot be either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or a space.",
							toString() ) );

	if ( ( _name.substr( 0, Arg::flagStartString().length() ) == Arg::flagStartString() ) ||
		 ( _name.substr( 0, Arg::nameStartString().length() ) == Arg::nameStartString() ) ||
		 ( _name.find( " ", 0 ) != std::string::npos ) )
		throw(SpecificationException("Argument name begin with either '" +
							Arg::flagStartString() + "' or '" +
							Arg::nameStartString() + "' or space.",
							toString() ) );

}